

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O1

Inta_Man_t * Inta_ManAlloc(void)

{
  Inta_Man_t *__s;
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  __s = (Inta_Man_t *)malloc(0xa8);
  memset(__s,0,0xa8);
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  pVVar1->nCap = 1000;
  pVVar1->nSize = 0;
  piVar2 = (int *)malloc(4000);
  pVVar1->pArray = piVar2;
  __s->vResLits = pVVar1;
  __s->fProofVerif = 1;
  __s->fProofWrite = 0;
  return __s;
}

Assistant:

Inta_Man_t * Inta_ManAlloc()
{
    Inta_Man_t * p;
    // allocate the manager
    p = (Inta_Man_t *)ABC_ALLOC( char, sizeof(Inta_Man_t) );
    memset( p, 0, sizeof(Inta_Man_t) );
    // verification
    p->vResLits = Vec_IntAlloc( 1000 );
    // parameters
    p->fProofWrite = 0;
    p->fProofVerif = 1;
    return p;    
}